

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O3

bool __thiscall BmsParser::Parser::Parse(Parser *this,char *text)

{
  _Map_pointer ppbVar1;
  bool bVar2;
  int iVar3;
  char *out;
  char *pcVar4;
  string buf;
  char *local_58;
  value_type local_50;
  
  Clear(this);
  BmsBms::Clear(this->bms_);
  WriteLogLine(this,"Bms parsing started");
  iVar3 = BmsUtil::IsUTF8(text);
  if (iVar3 == 0) {
    out = (char *)operator_new__(0xa00000);
    bVar2 = BmsUtil::convert_to_utf8(text,out,"Shift_JIS",0xa00000);
    local_58 = out;
    if (bVar2) goto LAB_001319fe;
    operator_delete(out);
  }
  local_58 = (char *)0x0;
  out = text;
LAB_001319fe:
  do {
    if ((out == (char *)0x0) || (this->panic_ != false)) break;
    for (; (*out == ' ' || (*out == '\t')); out = out + 1) {
    }
    pcVar4 = strchr(out,10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    if (pcVar4 == (char *)0x0) {
      strlen(out);
    }
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)out);
    while (((local_50._M_string_length != 0 &&
            ((ulong)(byte)local_50._M_dataplus._M_p[local_50._M_string_length - 1] < 0x21)) &&
           ((0x100002200U >>
             ((ulong)(byte)local_50._M_dataplus._M_p[local_50._M_string_length - 1] & 0x3f) & 1) !=
            0))) {
      std::__cxx11::string::resize((ulong)&local_50,(char)local_50._M_string_length + -1);
    }
    bVar2 = IsRandomStatement(this,local_50._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&this->syntax_line_data_ + (ulong)!bVar2 * 0x20),&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    out = pcVar4 + 1;
  } while (pcVar4 != (char *)0x0);
  if (local_58 != (char *)0x0) {
    operator_delete__(local_58);
  }
  ppbVar1 = (this->syntax_tag_).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->syntax_tag_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->syntax_tag_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
      ((long)(this->syntax_tag_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->syntax_tag_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)ppbVar1 -
                (long)(this->syntax_tag_).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppbVar1 == (_Map_pointer)0x0)) * 0x10 == 0) {
    if ((this->panic_ & 1U) == 0) {
      ParseLines(this);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    WriteLogLine(this,"parsing error - statement hadn\'t finished completely.");
    this->panic_ = true;
  }
  return bVar2;
}

Assistant:

bool Parser::Parse(const char* text) {
		// initalize first
		Clear();
		bms_.Clear();
		WriteLogLine("Bms parsing started");

		// detect encoding
		char* encodetext = 0;
		if (!BmsUtil::IsUTF8(text)) {
			encodetext = new char[1024 * 1024 * 10];
			bool r = BmsUtil::convert_to_utf8(text, encodetext,
				BmsBelOption::DEFAULT_FALLBACK_ENCODING, 1024 * 1024 * 10);
			if (!r) {
				delete encodetext;
				encodetext = 0;
			}
			else {
				text = encodetext;
			}
		}

		// split lines
		for (const char *p = text; p && !panic_;) {
			// trim first
			p = Trim(p);
			// cut command
			const char* pn = strchr(p, '\n');
			std::string buf;
			if (!pn)
				buf.assign(p);
			else
				buf.assign(p, pn - p);
			// trim end of the line
			while (buf.size() > 0) {
				if (buf.back() == '\r' || buf.back() == ' ' || buf.back() == '\t')
					//buf.pop_back(); - don't work in travis
					buf.resize(buf.size() - 1);
				else
					break;
			}
			/*
			 * it's more easy and better to distinguish random statement in here
			 */
			if (IsRandomStatement(buf.c_str()))
				syntax_line_data_.push_back(buf);
			else
				line_data_.push_back(buf);
			if (!pn) break;
			p = pn + 1;
		}
		if (encodetext)
			delete[] encodetext;

		// if there's panic in random statement,
		// stop parsing
		if (syntax_tag_.size() != 0) {
			WriteLogLine("parsing error - statement hadn't finished completely.");
			panic_ = true;
		}
		if (panic_) return false;

		// parse lines
		return ParseLines();
	}